

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall cnn::LookupParameters::squared_l2norm(LookupParameters *this,float *sqnorm)

{
  ulong uVar1;
  size_type sVar2;
  float *in_RSI;
  long in_RDI;
  RealScalar RVar3;
  uint i;
  float a;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffffe0;
  uint uVar4;
  float fVar5;
  
  fVar5 = 0.0;
  uVar4 = 0;
  while( true ) {
    uVar1 = (ulong)uVar4;
    sVar2 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::size
                      ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 0x30));
    if (sVar2 <= uVar1) break;
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
              ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 0x30),(ulong)uVar4);
    Tensor::operator*((Tensor *)CONCAT44(fVar5,uVar4));
    RVar3 = Eigen::
            MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
            ::squaredNorm(in_stack_ffffffffffffffe0);
    fVar5 = RVar3 + fVar5;
    uVar4 = uVar4 + 1;
  }
  *in_RSI = fVar5;
  return;
}

Assistant:

void LookupParameters::squared_l2norm(float* sqnorm) const {
#if HAVE_CUDA
  bool acc = false;
  for (unsigned i = 0; i < values.size(); ++i) {
    gpu::l2_norm_reducer(values[i].d.size(), values[i].v, sqnorm, true, acc);
    acc = true;
  }
#else
  float a = 0;
  for (unsigned i = 0; i < values.size(); ++i)
    a += (*values[i]).squaredNorm();
  *sqnorm = a;
#endif
}